

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O3

String * __thiscall String::mid(String *__return_storage_ptr__,String *this,size_t from,size_t l)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  pointer pcVar3;
  size_t sVar4;
  _Alloc_hider local_30;
  size_type local_28;
  size_type local_20;
  undefined8 uStack_18;
  
  sVar2 = (this->mString)._M_string_length;
  sVar4 = sVar2 - from;
  if (l != 0xffffffffffffffff) {
    sVar4 = l;
  }
  if ((from == 0) && (sVar4 == sVar2)) {
    (__return_storage_ptr__->mString)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mString).field_2;
    pcVar3 = (this->mString)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)this);
    paVar1 = &(__return_storage_ptr__->mString).field_2;
    (__return_storage_ptr__->mString)._M_dataplus._M_p = (pointer)paVar1;
    if ((size_type *)local_30._M_p == &local_20) {
      paVar1->_M_allocated_capacity = local_20;
      *(undefined8 *)((long)&(__return_storage_ptr__->mString).field_2 + 8) = uStack_18;
    }
    else {
      (__return_storage_ptr__->mString)._M_dataplus._M_p = local_30._M_p;
      (__return_storage_ptr__->mString).field_2._M_allocated_capacity = local_20;
    }
    (__return_storage_ptr__->mString)._M_string_length = local_28;
  }
  return __return_storage_ptr__;
}

Assistant:

String mid(size_t from, size_t l = npos) const
    {
        if (l == npos)
            l = size() - from;
        if (from == 0 && l == size())
            return *this;
        return mString.substr(from, l);
    }